

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O0

int Gia_ObjCheckMffc_rec(Gia_Man_t *p,Gia_Obj_t *pObj,int Limit,Vec_Int_t *vNodes)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  int iFanin;
  Vec_Int_t *vNodes_local;
  int Limit_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsCi(pObj);
  if (iVar1 != 0) {
    return 1;
  }
  iVar1 = Gia_ObjIsAnd(pObj);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaResub.c"
                  ,0x35,"int Gia_ObjCheckMffc_rec(Gia_Man_t *, Gia_Obj_t *, int, Vec_Int_t *)");
  }
  iVar1 = Gia_ObjFaninId0p(p,pObj);
  Vec_IntPush(vNodes,iVar1);
  iVar1 = Gia_ObjRefDecId(p,iVar1);
  if (iVar1 == 0) {
    iVar1 = Vec_IntSize(vNodes);
    if (Limit < iVar1) {
      return 0;
    }
    pGVar2 = Gia_ObjFanin0(pObj);
    iVar1 = Gia_ObjCheckMffc_rec(p,pGVar2,Limit,vNodes);
    if (iVar1 == 0) {
      return 0;
    }
  }
  iVar1 = Gia_ObjFaninId1p(p,pObj);
  Vec_IntPush(vNodes,iVar1);
  iVar1 = Gia_ObjRefDecId(p,iVar1);
  if (iVar1 == 0) {
    iVar1 = Vec_IntSize(vNodes);
    if (Limit < iVar1) {
      return 0;
    }
    pGVar2 = Gia_ObjFanin1(pObj);
    iVar1 = Gia_ObjCheckMffc_rec(p,pGVar2,Limit,vNodes);
    if (iVar1 == 0) {
      return 0;
    }
  }
  iVar1 = Gia_ObjIsMux(p,pObj);
  if (iVar1 == 0) {
    return 1;
  }
  iVar1 = Gia_ObjFaninId2p(p,pObj);
  Vec_IntPush(vNodes,iVar1);
  iVar1 = Gia_ObjRefDecId(p,iVar1);
  if (iVar1 == 0) {
    iVar1 = Vec_IntSize(vNodes);
    if (iVar1 <= Limit) {
      pGVar2 = Gia_ObjFanin2(p,pObj);
      iVar1 = Gia_ObjCheckMffc_rec(p,pGVar2,Limit,vNodes);
      if (iVar1 != 0) goto LAB_00954d4c;
    }
    p_local._4_4_ = 0;
  }
  else {
LAB_00954d4c:
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Computes MFFCs of all qualifying nodes.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Gia_ObjCheckMffc_rec( Gia_Man_t * p,Gia_Obj_t * pObj, int Limit, Vec_Int_t * vNodes )
{
    int iFanin;
    if ( Gia_ObjIsCi(pObj) )
        return 1;
    assert( Gia_ObjIsAnd(pObj) );
    iFanin = Gia_ObjFaninId0p(p, pObj);
    Vec_IntPush( vNodes, iFanin );
    if ( !Gia_ObjRefDecId(p, iFanin) && (Vec_IntSize(vNodes) > Limit || !Gia_ObjCheckMffc_rec(p, Gia_ObjFanin0(pObj), Limit, vNodes)) )
        return 0;
    iFanin = Gia_ObjFaninId1p(p, pObj);
    Vec_IntPush( vNodes, iFanin );
    if ( !Gia_ObjRefDecId(p, iFanin) && (Vec_IntSize(vNodes) > Limit || !Gia_ObjCheckMffc_rec(p, Gia_ObjFanin1(pObj), Limit, vNodes)) )
        return 0;
    if ( !Gia_ObjIsMux(p, pObj) )
        return 1;
    iFanin = Gia_ObjFaninId2p(p, pObj);
    Vec_IntPush( vNodes, iFanin );
    if ( !Gia_ObjRefDecId(p, iFanin) && (Vec_IntSize(vNodes) > Limit || !Gia_ObjCheckMffc_rec(p, Gia_ObjFanin2(p, pObj), Limit, vNodes)) )
        return 0;
    return 1;
}